

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O0

void __thiscall
jsoncons::jsonschema::
contains_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
contains_validator(contains_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *schema,
                  uri *schema_location,string *custom_message,
                  schema_validator_ptr_type *schema_validator,
                  unique_ptr<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  *max_contains,
                  unique_ptr<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  *min_contains)

{
  unique_ptr<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  unique_ptr<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *this_00;
  string *in_stack_ffffffffffffff98;
  uri *in_stack_ffffffffffffffa0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  void **in_stack_ffffffffffffffb8;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  validator_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  validator_base((validator_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)(in_RDI + 0x1f));
  this_00 = (unique_ptr<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
             *)&stack0xffffffffffffffaf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  keyword_validator((keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0
                    ,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
  (in_RDI->_M_t).
  super___uniq_ptr_impl<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        *)0x1347980;
  in_RDI[0x1f]._M_t.
  super___uniq_ptr_impl<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        *)0x1347a08;
  std::
  unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  ::unique_ptr((unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)this_00,
               (unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)in_RDI);
  std::
  unique_ptr<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::max_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  ::unique_ptr(this_00,in_RDI);
  std::
  unique_ptr<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  ::unique_ptr((unique_ptr<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)this_00,
               (unique_ptr<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::min_contains_keyword<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)in_RDI);
  return;
}

Assistant:

contains_validator(const Json& schema, const uri& schema_location, const std::string& custom_message,
            schema_validator_ptr_type&& schema_validator,
            std::unique_ptr<max_contains_keyword<Json>>&& max_contains,
            std::unique_ptr<min_contains_keyword<Json>>&& min_contains)
            : keyword_validator<Json>("contains", schema, std::move(schema_location), custom_message), 
              schema_validator_(std::move(schema_validator)),
              max_contains_(std::move(max_contains)),
              min_contains_(std::move(min_contains))
        {
        }